

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::LowerInclusiveBetweenOperator,false,false,true>
                (string_t *adata,string_t *bdata,string_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_16_2_67f50693_for_value local_60;
  anon_union_16_2_67f50693_for_value local_50;
  anon_union_16_2_67f50693_for_value local_40;
  
  if (count == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar8 = uVar6;
      if (result_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)result_sel->sel_vector[uVar6];
      }
      uVar4 = uVar6;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)asel->sel_vector[uVar6];
      }
      uVar7 = uVar6;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)bsel->sel_vector[uVar6];
      }
      uVar3 = uVar6;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)csel->sel_vector[uVar6];
      }
      puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0))
          && ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0))))
         && ((puVar1 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar1 == (unsigned_long *)0x0 || ((puVar1[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0))))
      {
        local_60._0_8_ = *(undefined8 *)&adata[uVar4].value;
        local_60.pointer.ptr = adata[uVar4].value.pointer.ptr;
        local_40._0_8_ = *(undefined8 *)&bdata[uVar7].value;
        local_40.pointer.ptr = bdata[uVar7].value.pointer.ptr;
        local_50._0_8_ = *(undefined8 *)&cdata[uVar3].value;
        local_50.pointer.ptr = cdata[uVar3].value.pointer.ptr;
        bVar2 = string_t::StringComparisonOperators::GreaterThan
                          ((string_t *)&local_40.pointer,(string_t *)&local_60.pointer);
        uVar4 = 1;
        if (!bVar2) {
          bVar2 = string_t::StringComparisonOperators::GreaterThan
                            ((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
          uVar4 = (ulong)!bVar2;
        }
      }
      else {
        uVar4 = 1;
      }
      false_sel->sel_vector[lVar5] = (sel_t)uVar8;
      lVar5 = uVar4 + lVar5;
      uVar6 = uVar6 + 1;
    } while (count != uVar6);
  }
  return count - lVar5;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}